

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

void duckdb::MergeUpdateLoop<unsigned_long>
               (UpdateInfo *base_info,Vector *base_data,UpdateInfo *update_info,
               UnifiedVectorFormat *update,row_t *ids,idx_t count,SelectionVector *sel)

{
  UpdateInfo *__dest;
  uint uVar1;
  uint uVar2;
  sel_t sVar3;
  void *__dest_00;
  long lVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  anon_class_40_5_fa23cdf1 *count_00;
  ulong uVar8;
  idx_t i;
  ulong uVar9;
  size_t sVar10;
  unsigned_long *puVar11;
  idx_t id;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  sel_t result_ids [2048];
  unsigned_long result_values [2048];
  idx_t local_60b8;
  UpdateInfo *local_60b0;
  idx_t local_60a8;
  void *local_60a0;
  UpdateInfo *local_6098;
  long local_6090;
  UpdateInfo *local_6088;
  SelectionVector *local_6080;
  data_ptr_t local_6078;
  sel_t *local_6070;
  unsigned_long *local_6068;
  anon_class_40_5_fa23cdf1 local_6060;
  sel_t local_6038 [2048];
  unsigned_long local_4038 [2049];
  
  local_6078 = base_data->data;
  local_6080 = update->sel;
  local_6068 = (unsigned_long *)update->data;
  lVar6 = base_info->vector_index * 0x800 + base_info->segment->column_data->start;
  __dest = base_info + 1;
  __dest_00 = (void *)((long)&base_info[1].segment + (ulong)base_info->max * 4);
  local_6098 = update_info + 1;
  local_60a0 = (void *)((long)&update_info[1].segment + (ulong)update_info->max * 4);
  local_6090 = (ulong)update_info->max * 4;
  local_6070 = sel->sel_vector;
  uVar1 = update_info->N;
  uVar15 = (ulong)base_info->N;
  lVar7 = 0;
  uVar9 = 0;
  uVar16 = 0;
  uVar13 = 0;
  while( true ) {
    if (uVar9 == count) break;
    uVar8 = uVar9;
    if (local_6070 != (sel_t *)0x0) {
      uVar8 = (ulong)local_6070[uVar9];
    }
    uVar8 = ids[uVar8] - lVar6;
    for (lVar4 = 0; lVar4 + uVar16 < (ulong)uVar1; lVar4 = lVar4 + 1) {
      uVar2 = *(uint *)((long)&local_6098->segment + lVar4 * 4 + uVar16 * 4);
      if (uVar8 <= uVar2) {
        if (uVar8 == uVar2) {
          local_4038[lVar7 + lVar4] = *(unsigned_long *)((long)local_60a0 + lVar4 * 8 + uVar16 * 8);
          local_6038[lVar7 + lVar4] = uVar2;
          uVar14 = uVar13;
          uVar16 = lVar4 + uVar16 + 1;
          goto LAB_0053c7fc;
        }
        break;
      }
      local_4038[lVar7 + lVar4] = *(unsigned_long *)((long)local_60a0 + lVar4 * 8 + uVar16 * 8);
      local_6038[lVar7 + lVar4] = uVar2;
    }
    uVar14 = uVar15;
    if (uVar15 < uVar13) {
      uVar14 = uVar13;
    }
    puVar11 = (unsigned_long *)((long)__dest_00 + uVar13 * 8);
    for (; uVar13 < uVar15; uVar13 = uVar13 + 1) {
      uVar12 = (ulong)*(uint *)((long)&__dest->segment + uVar13 * 4);
      if (uVar8 <= uVar12) {
        uVar14 = uVar13;
        if (uVar8 == uVar12) goto LAB_0053c7ef;
        break;
      }
      puVar11 = puVar11 + 1;
    }
    puVar11 = (unsigned_long *)(local_6078 + uVar8 * 8);
LAB_0053c7ef:
    local_4038[lVar7 + lVar4] = *puVar11;
    local_6038[lVar7 + lVar4] = (sel_t)uVar8;
    uVar16 = lVar4 + uVar16;
LAB_0053c7fc:
    lVar7 = lVar7 + lVar4 + 1;
    uVar9 = uVar9 + 1;
    uVar13 = uVar14;
  }
  sVar10 = lVar7 * 4;
  sVar5 = lVar7 * 8;
  for (lVar4 = 0; lVar4 + uVar16 < (ulong)uVar1; lVar4 = lVar4 + 1) {
    local_4038[lVar7 + lVar4] =
         *(unsigned_long *)((long)&update_info[1].segment + lVar4 * 8 + uVar16 * 8 + local_6090);
    local_6038[lVar7 + lVar4] = *(sel_t *)((long)&update_info[1].segment + lVar4 * 4 + uVar16 * 4);
    sVar10 = sVar10 + 4;
    sVar5 = sVar5 + 8;
  }
  update_info->N = (int)lVar7 + (int)lVar4;
  local_60b0 = base_info;
  local_60a8 = count;
  local_6088 = update_info;
  switchD_00917c1c::default(local_60a0,(unsigned_long (*) [2048])local_4038,sVar5);
  switchD_00917c1c::default(local_6098,&local_6038,sVar10);
  local_6060.result_offset = &local_60b8;
  local_60b8 = 0;
  count_00 = &local_6060;
  local_6060.update_vector_data = &local_6068;
  local_6060.update_vector_sel = local_6080;
  uVar1 = local_60b0->N;
  lVar7 = 0;
  uVar16 = 0;
  uVar13 = 0;
  local_6060.result_values = (unsigned_long (*) [2048])local_4038;
  local_6060.result_ids = &local_6038;
  do {
    while( true ) {
      if ((count <= uVar13) || (uVar1 <= uVar16)) {
        for (; uVar13 < count; uVar13 = uVar13 + 1) {
          uVar9 = uVar13;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar9 = (ulong)sel->sel_vector[uVar13];
          }
          MergeUpdateLoopInternal<unsigned_long,_unsigned_long,_duckdb::ExtractStandardEntry>::
          anon_class_40_5_fa23cdf1::operator()(&local_6060,ids[uVar9] - lVar6,uVar9,(idx_t)count_00)
          ;
        }
        sVar10 = local_60b8 * 4;
        sVar5 = local_60b8 * 8;
        for (lVar6 = 0; lVar6 + uVar16 < (ulong)uVar1; lVar6 = lVar6 + 1) {
          sVar3 = *(sel_t *)((long)&__dest->segment + lVar7);
          local_4038[local_60b8 + lVar6] = *(unsigned_long *)((long)__dest_00 + lVar7 * 2);
          local_6038[local_60b8 + lVar6] = sVar3;
          sVar10 = sVar10 + 4;
          sVar5 = sVar5 + 8;
          lVar7 = lVar7 + 4;
        }
        local_60b0->N = (int)local_60b8 + (int)lVar6;
        switchD_00917c1c::default(__dest_00,local_4038,sVar5);
        switchD_00917c1c::default(__dest,local_6038,sVar10);
        return;
      }
      uVar9 = uVar13;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar9 = (ulong)sel->sel_vector[uVar13];
      }
      id = ids[uVar9] - lVar6;
      uVar2 = *(uint *)((long)&__dest->segment + uVar16 * 4);
      if (id != uVar2) break;
      MergeUpdateLoopInternal<unsigned_long,_unsigned_long,_duckdb::ExtractStandardEntry>::
      anon_class_40_5_fa23cdf1::operator()(&local_6060,id,uVar9,(idx_t)count_00);
      uVar13 = uVar13 + 1;
LAB_0053c963:
      uVar16 = uVar16 + 1;
      lVar7 = lVar7 + 4;
    }
    if (uVar2 <= id) {
      count_00 = *(anon_class_40_5_fa23cdf1 **)((long)__dest_00 + uVar16 * 8);
      local_4038[local_60b8] = (unsigned_long)count_00;
      local_6038[local_60b8] = uVar2;
      local_60b8 = local_60b8 + 1;
      goto LAB_0053c963;
    }
    MergeUpdateLoopInternal<unsigned_long,_unsigned_long,_duckdb::ExtractStandardEntry>::
    anon_class_40_5_fa23cdf1::operator()(&local_6060,id,uVar9,(idx_t)count_00);
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

static void MergeUpdateLoop(UpdateInfo &base_info, Vector &base_data, UpdateInfo &update_info,
                            UnifiedVectorFormat &update, row_t *ids, idx_t count, const SelectionVector &sel) {
	auto base_table_data = FlatVector::GetData<T>(base_data);
	auto update_vector_data = update.GetData<T>(update);
	MergeUpdateLoopInternal<T, T>(base_info, base_table_data, update_info, *update.sel, update_vector_data, ids, count,
	                              sel);
}